

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O3

void cross_validation(problem *prob,parameter *param,int nr_fold,double *target)

{
  uint uVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  int iVar6;
  void *__ptr;
  uint *__ptr_00;
  long lVar7;
  ulong uVar8;
  model *model_;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  model *model_ptr;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  problem subprob;
  problem local_70;
  ulong local_50;
  ulong local_48;
  parameter *local_40;
  ulong local_38;
  
  uVar10 = (ulong)(uint)nr_fold;
  uVar1 = prob->l;
  uVar8 = (ulong)uVar1;
  local_40 = param;
  __ptr = malloc((long)(int)uVar1 * 4);
  if ((int)uVar1 < nr_fold) {
    cross_validation_cold_1();
    uVar10 = (ulong)uVar1;
  }
  iVar12 = (int)uVar10;
  uVar5 = iVar12 + 1;
  __ptr_00 = (uint *)malloc((long)(int)uVar5 << 2);
  auVar4 = _DAT_0010c0c0;
  if (0 < (int)uVar1) {
    lVar11 = uVar8 - 1;
    auVar14._8_4_ = (int)lVar11;
    auVar14._0_8_ = lVar11;
    auVar14._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar9 = 0;
    auVar14 = auVar14 ^ _DAT_0010c0c0;
    auVar17 = _DAT_0010c0b0;
    do {
      auVar16 = auVar17 ^ auVar4;
      if ((bool)(~(auVar14._4_4_ < auVar16._4_4_ ||
                  auVar14._0_4_ < auVar16._0_4_ && auVar16._4_4_ == auVar14._4_4_) & 1)) {
        *(int *)((long)__ptr + uVar9 * 4) = (int)uVar9;
      }
      if (auVar16._12_4_ <= auVar14._12_4_ &&
          (auVar16._8_4_ <= auVar14._8_4_ || auVar16._12_4_ != auVar14._12_4_)) {
        *(int *)((long)__ptr + uVar9 * 4 + 4) = (int)uVar9 + 1;
      }
      uVar9 = uVar9 + 2;
      lVar11 = auVar17._8_8_;
      auVar17._0_8_ = auVar17._0_8_ + 2;
      auVar17._8_8_ = lVar11 + 2;
    } while ((uVar1 + 1 & 0xfffffffe) != uVar9);
    if (0 < (int)uVar1) {
      lVar11 = 0;
      uVar9 = uVar8;
      do {
        iVar6 = rand();
        lVar7 = iVar6 % (int)uVar9 + lVar11;
        uVar2 = *(undefined4 *)((long)__ptr + lVar11 * 4);
        *(undefined4 *)((long)__ptr + lVar11 * 4) = *(undefined4 *)((long)__ptr + lVar7 * 4);
        *(undefined4 *)((long)__ptr + lVar7 * 4) = uVar2;
        lVar11 = lVar11 + 1;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
  }
  auVar4 = _DAT_0010c0c0;
  if (-1 < iVar12) {
    lVar11 = (ulong)uVar5 - 1;
    auVar15._8_4_ = (int)lVar11;
    auVar15._0_8_ = lVar11;
    auVar15._12_4_ = (int)((ulong)lVar11 >> 0x20);
    iVar6 = 0;
    auVar15 = auVar15 ^ _DAT_0010c0c0;
    uVar9 = 0;
    auVar16 = _DAT_0010c0b0;
    do {
      auVar17 = auVar16 ^ auVar4;
      if ((bool)(~(auVar17._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar17._0_4_ ||
                  auVar15._4_4_ < auVar17._4_4_) & 1)) {
        *(int *)((long)__ptr_00 + uVar9) = iVar6 / iVar12;
      }
      if ((auVar17._12_4_ != auVar15._12_4_ || auVar17._8_4_ <= auVar15._8_4_) &&
          auVar17._12_4_ <= auVar15._12_4_) {
        *(int *)((long)__ptr_00 + uVar9 + 4) = (int)(iVar6 + uVar1) / iVar12;
      }
      lVar11 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 2;
      auVar16._8_8_ = lVar11 + 2;
      uVar9 = uVar9 + 8;
      iVar6 = iVar6 + uVar1 * 2;
    } while (((ulong)uVar5 * 4 + 4 & 0xfffffffffffffff8) != uVar9);
    uVar9 = 0;
    uVar5 = *__ptr_00;
    local_50 = uVar10;
    local_48 = uVar8;
    do {
      uVar3 = __ptr_00[uVar9 + 1];
      local_70.bias = prob->bias;
      local_70.n = prob->n;
      iVar12 = (int)local_48;
      local_70.l = (uVar5 - uVar3) + iVar12;
      lVar11 = (long)local_70.l;
      local_38 = uVar9;
      local_70.x = (feature_node **)malloc(lVar11 << 3);
      local_70.y = (double *)malloc(lVar11 << 3);
      if ((int)uVar5 < 1) {
        uVar8 = 0;
      }
      else {
        uVar8 = (ulong)uVar5;
        uVar10 = 0;
        do {
          iVar6 = *(int *)((long)__ptr + uVar10 * 4);
          local_70.x[uVar10] = prob->x[iVar6];
          local_70.y[uVar10] = prob->y[iVar6];
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
      }
      if ((int)uVar3 < iVar12) {
        lVar11 = (long)(int)uVar3;
        do {
          iVar12 = *(int *)((long)__ptr + lVar11 * 4);
          local_70.x[uVar8] = prob->x[iVar12];
          local_70.y[uVar8] = prob->y[iVar12];
          uVar8 = uVar8 + 1;
          lVar11 = lVar11 + 1;
        } while ((int)uVar1 != lVar11);
      }
      model_ = train(&local_70,local_40);
      if ((int)uVar5 < (int)uVar3) {
        lVar11 = 0;
        do {
          iVar12 = *(int *)((long)__ptr + lVar11 * 4 + (long)(int)uVar5 * 4);
          dVar13 = predict(model_,prob->x[iVar12]);
          target[iVar12] = dVar13;
          lVar11 = lVar11 + 1;
        } while (uVar3 - uVar5 != (int)lVar11);
      }
      if (model_ != (model *)0x0) {
        free_model_content(model_);
        free(model_);
      }
      uVar9 = local_38 + 1;
      free(local_70.x);
      free(local_70.y);
      uVar5 = uVar3;
    } while (uVar9 != local_50);
  }
  free(__ptr_00);
  free(__ptr);
  return;
}

Assistant:

void cross_validation(const problem *prob, const parameter *param, int nr_fold, double *target)
{
	int i;
	int *fold_start;
	int l = prob->l;
	int *perm = Malloc(int,l);
	if (nr_fold > l)
	{
		nr_fold = l;
		fprintf(stderr,"WARNING: # folds > # data. Will use # folds = # data instead (i.e., leave-one-out cross validation)\n");
	}
	fold_start = Malloc(int,nr_fold+1);
	for(i=0;i<l;i++) perm[i]=i;
	for(i=0;i<l;i++)
	{
		int j = i+rand()%(l-i);
		swap(perm[i],perm[j]);
	}
	for(i=0;i<=nr_fold;i++)
		fold_start[i]=i*l/nr_fold;

#ifdef CV_OMP
#pragma omp parallel for private(i) schedule(dynamic)
#endif
	for(i=0;i<nr_fold;i++)
	{
		int begin = fold_start[i];
		int end = fold_start[i+1];
		int j,k;
		struct problem subprob;

		subprob.bias = prob->bias;
		subprob.n = prob->n;
		subprob.l = l-(end-begin);
		subprob.x = Malloc(struct feature_node*,subprob.l);
		subprob.y = Malloc(double,subprob.l);

		k=0;
		for(j=0;j<begin;j++)
		{
			subprob.x[k] = prob->x[perm[j]];
			subprob.y[k] = prob->y[perm[j]];
			++k;
		}
		for(j=end;j<l;j++)
		{
			subprob.x[k] = prob->x[perm[j]];
			subprob.y[k] = prob->y[perm[j]];
			++k;
		}
		struct model *submodel = train(&subprob,param);
		for(j=begin;j<end;j++)
			target[perm[j]] = predict(submodel,prob->x[perm[j]]);
		free_and_destroy_model(&submodel);
		free(subprob.x);
		free(subprob.y);
	}
	free(fold_start);
	free(perm);
}